

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

bool __thiscall
VulkanHppGenerator::allVectorSizesSupported
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
          *params,map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  *vectorParams)

{
  bool bVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  
  p_Var3 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(vectorParams->_M_t)._M_impl.super__Rb_tree_header) {
      return true;
    }
    bVar1 = TypeInfo::isValue(&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start[(long)p_Var3[1]._M_parent]
                               .type);
    if ((!bVar1) ||
       (((iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&(params->
                           super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                           )._M_impl.super__Vector_impl_data._M_start[(long)p_Var3[1]._M_parent].
                           type.type,"uint32_t"), iVar2 != 0 &&
         (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&(params->
                           super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                           )._M_impl.super__Vector_impl_data._M_start[(long)p_Var3[1]._M_parent].
                           type.type,"VkDeviceSize"), iVar2 != 0)) &&
        (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(&(params->
                          super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                          )._M_impl.super__Vector_impl_data._M_start[(long)p_Var3[1]._M_parent].type
                          .type,"VkSampleCountFlagBits"), iVar2 != 0)))) break;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  return false;
}

Assistant:

bool VulkanHppGenerator::allVectorSizesSupported( std::vector<ParamData> const & params, std::map<size_t, VectorParamData> const & vectorParams ) const
{
  // check if all vector sizes are by value and their type is one of "uint32_t", "VkDeviceSize", or "VkSampleCountFlagBits"
  return std::ranges::all_of( vectorParams,
                              [&params]( auto const & vpi )
                              {
                                return params[vpi.second.lenParam].type.isValue() && ( ( params[vpi.second.lenParam].type.type == "uint32_t" ) ||
                                                                                       ( params[vpi.second.lenParam].type.type == "VkDeviceSize" ) ||
                                                                                       ( params[vpi.second.lenParam].type.type == "VkSampleCountFlagBits" ) );
                              } );
}